

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_Sessionid_Test::TestBody(InterpreterTestSuite_PC_Sessionid_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *this_00;
  _func_void__Any_data_ptr_unsigned_short_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  char *in_R9;
  initializer_list<testing::Action<void_(unsigned_short_&)>_> __l;
  AssertionResult gtest_ar_;
  Action<void_(unsigned_short_&)> converted;
  Expression expr;
  Value value;
  TestContext ctx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  undefined8 uStack_320;
  _Any_data local_318;
  pointer local_308;
  code *pcStack_300;
  _Any_data local_2f8;
  pointer local_2e8;
  code *pcStack_2e0;
  _Any_data local_2d8;
  pointer local_2c8;
  code *pcStack_2c0;
  undefined1 local_2b8 [8];
  _Alloc_hider _Stack_2b0;
  undefined1 local_2a8 [8];
  undefined1 local_2a0 [16];
  _Alloc_hider local_290;
  _Invoker_type p_Stack_288;
  undefined1 local_280 [24];
  Expression local_268;
  _Any_data local_250;
  code *local_240;
  undefined8 uStack_238;
  testing local_230 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  Matcher<unsigned_short_&> local_220;
  ReturnAction local_208 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  MockSpec<ot::commissioner::Error_(unsigned_short_&)> local_1f0;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  Error local_188;
  TestContext local_160;
  
  InterpreterTestSuite::TestContext::TestContext(&local_160);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_160);
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0._0_4_ = kNone;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1a8._M_p = (pointer)&local_198;
  local_220.super_MatcherBase<unsigned_short_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)operator_new(8);
  ((local_220.super_MatcherBase<unsigned_short_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_003a60c0;
  local_220.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a10c0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<unsigned_short&>const*>
            (&local_220.super_MatcherBase<unsigned_short_&>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_220.super_MatcherBase<unsigned_short_&>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_220.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a1078;
  CommissionerAppMock::gmock_GetSessionId
            (&local_1f0,
             local_160.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_220);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
            InternalExpectedAt(&local_1f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0x6b3,"*ctx.mDefaultCommissionerObject","GetSessionId(_)");
  paVar1 = &local_188.mMessage.field_2;
  local_188.mCode = kNone;
  local_188.mMessage._M_string_length = 0;
  local_188.mMessage.field_2._M_local_buf[0] = '\0';
  local_188.mMessage._M_dataplus._M_p = (pointer)paVar1;
  testing::Return<ot::commissioner::Error>(local_230,&local_188);
  if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_228->_M_use_count = local_228->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_228->_M_use_count = local_228->_M_use_count + 1;
    }
  }
  local_200 = local_228;
  pcStack_300 = std::
                _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1716:36)>
                ::_M_invoke;
  local_308 = (pointer)std::
                       _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1716:36)>
                       ::_M_manager;
  local_318._8_8_ = 0;
  local_318._M_unused._M_object = (void *)0x0;
  uStack_320 = 0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::function<void_(unsigned_short_&)>::function
            ((function<void_(unsigned_short_&)> *)&local_250,
             (function<void_(unsigned_short_&)> *)&local_318);
  local_2c8 = (pointer)0x0;
  pcStack_2c0 = (code *)0x0;
  local_2d8._M_unused._M_object = (void *)0x0;
  local_2d8._8_8_ = 0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_320 = 0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8._M_unused._M_object = operator_new(0x20);
  pbVar3 = local_2c8;
  *(undefined8 *)local_2d8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_2d8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_2d8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_2d8._M_unused._0_8_ + 0x18) = uStack_238;
  if (local_240 != (code *)0x0) {
    *(void **)local_2d8._M_unused._0_8_ = local_250._M_unused._M_object;
    *(undefined8 *)((long)local_2d8._M_unused._0_8_ + 8) = local_250._8_8_;
    *(code **)((long)local_2d8._M_unused._0_8_ + 0x10) = local_240;
    local_240 = (code *)0x0;
    uStack_238 = 0;
  }
  local_2d8._8_8_ =
       local_338.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2c8;
  local_2c8 = (pointer)std::_Function_handler::operator_cast_to_Action;
  uStack_320 = pcStack_2c0;
  pcStack_2c0 = std::_Function_handler::operator_cast_to_Action;
  if (pbVar3 != (pointer)0x0) {
    (*(code *)pbVar3)(&local_338,&local_338,3);
  }
  if (local_240 != (code *)0x0) {
    (*local_240)(&local_250,&local_250,__destroy_functor);
  }
  if (local_308 != (pointer)0x0) {
    (*(code *)local_308)(&local_318,&local_318,3);
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&local_2d8;
  std::
  vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
  ::vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
            *)local_2b8,__l,(allocator_type *)&local_338);
  if (local_2c8 != (pointer)0x0) {
    (*(code *)local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
  }
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(unsigned_short_&)> *)local_2a0,local_208);
  local_2e8 = (pointer)0x0;
  pcStack_2e0 = (code *)0x0;
  local_2f8._M_unused._M_object = (void *)0x0;
  local_2f8._8_8_ = 0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_320 = 0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8._M_unused._M_object = operator_new(0x38);
  pbVar3 = local_2e8;
  *(undefined1 (*) [8])local_2f8._M_unused._0_8_ = local_2b8;
  *(pointer *)((long)local_2f8._M_unused._0_8_ + 8) = _Stack_2b0._M_p;
  *(undefined1 (*) [8])((long)local_2f8._M_unused._0_8_ + 0x10) = local_2a8;
  local_2a8 = (undefined1  [8])0x0;
  local_2b8 = (undefined1  [8])0x0;
  _Stack_2b0._M_p = (pointer)0x0;
  *(undefined8 *)((long)local_2f8._M_unused._0_8_ + 0x28) = 0;
  *(undefined8 *)((long)local_2f8._M_unused._0_8_ + 0x18) = 0;
  *(undefined8 *)((long)local_2f8._M_unused._0_8_ + 0x20) = 0;
  *(_Invoker_type *)((long)local_2f8._M_unused._0_8_ + 0x30) = p_Stack_288;
  if ((_Manager_type)local_290._M_p != (_Manager_type)0x0) {
    *(undefined8 *)((long)local_2f8._M_unused._0_8_ + 0x18) = local_2a0._0_8_;
    *(undefined8 *)((long)local_2f8._M_unused._0_8_ + 0x20) = local_2a0._8_8_;
    *(pointer *)((long)local_2f8._M_unused._0_8_ + 0x28) = local_290._M_p;
    local_290._M_p = (pointer)0x0;
    p_Stack_288 = (_Invoker_type)0x0;
  }
  local_2f8._8_8_ =
       local_338.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2e8;
  local_2e8 = (pointer)std::_Function_handler::operator_cast_to_Action;
  uStack_320 = pcStack_2e0;
  pcStack_2e0 = std::_Function_handler::operator_cast_to_Action;
  if (pbVar3 != (pointer)0x0) {
    (*(code *)pbVar3)(&local_338,&local_338,3);
  }
  if ((_Manager_type)local_290._M_p != (_Manager_type)0x0) {
    (*(code *)local_290._M_p)
              ((Action<ot::commissioner::Error_(unsigned_short_&)> *)local_2a0,
               (Action<ot::commissioner::Error_(unsigned_short_&)> *)local_2a0,3);
  }
  std::
  vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
  ::~vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
             *)local_2b8);
  testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::WillOnce
            (this_00,(Action<ot::commissioner::Error_(unsigned_short_&)> *)&local_2f8);
  if (local_2e8 != (pointer)0x0) {
    (*(code *)local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_188.mMessage._M_dataplus._M_p);
  }
  local_1f0.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short_&>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_short_&>,_false>._M_head_impl.
  super_MatcherBase<unsigned_short_&>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_003a10c0;
  if (local_1f0.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short_&>_>.
      super__Head_base<0UL,_testing::Matcher<unsigned_short_&>,_false>._M_head_impl.
      super_MatcherBase<unsigned_short_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f0.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short_&>_>.
               super__Head_base<0UL,_testing::Matcher<unsigned_short_&>,_false>._M_head_impl.
               super_MatcherBase<unsigned_short_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_220.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a10c0;
  if (local_220.super_MatcherBase<unsigned_short_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_220.super_MatcherBase<unsigned_short_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_2b8 = (undefined1  [8])local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"sessionid","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_318,&local_160.mInterpreter,(string *)local_2b8);
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_268.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_268.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_268.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_318._M_unused._0_8_;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_318._8_8_;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_308;
  local_318._M_unused._M_object = (long *)0x0;
  local_318._8_8_ = 0;
  local_308 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_318);
  if (local_2b8 != (undefined1  [8])local_2a8) {
    operator_delete((void *)local_2b8);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_2b8,&local_160.mInterpreter,&local_268);
  local_1d0._0_4_ = local_2b8._0_4_;
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)&_Stack_2b0);
  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_290);
  if (local_290._M_p != local_280) {
    operator_delete(local_290._M_p);
  }
  if ((Action<ot::commissioner::Error_(unsigned_short_&)> *)_Stack_2b0._M_p !=
      (Action<ot::commissioner::Error_(unsigned_short_&)> *)local_2a0) {
    operator_delete(_Stack_2b0._M_p);
  }
  bVar4 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_1d0);
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_338.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2b8,(internal *)&local_338,(AssertionResult *)0x2e6ffe,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x6b7,(char *)local_2b8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_250,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_250);
    if (local_2b8 != (undefined1  [8])local_2a8) {
      operator_delete((void *)local_2b8);
    }
    if ((long *)local_318._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_318._M_unused._M_object + 8))();
    }
  }
  pbVar3 = local_338.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_338.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    pcVar2 = ((local_338.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 !=
        &(local_338.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pbVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  InterpreterTestSuite::TestContext::~TestContext(&local_160);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Sessionid)
{
    TestContext ctx;
    InitContext(ctx);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([=](uint16_t &a) { a = 1; }), Return(Error{})));
    expr  = ctx.mInterpreter.ParseExpression("sessionid");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}